

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Aig_Man_t * Iso_ManTest(Aig_Man_t *pAig,int fVerbose)

{
  abctime aVar1;
  Vec_Int_t *p;
  abctime aVar2;
  abctime clk;
  Vec_Int_t *vPerm;
  int fVerbose_local;
  Aig_Man_t *pAig_local;
  
  aVar1 = Abc_Clock();
  p = Saig_ManFindIsoPerm(pAig,fVerbose);
  Vec_IntFree(p);
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Iso_ManTest( Aig_Man_t * pAig, int fVerbose )
{
    Vec_Int_t * vPerm;
    abctime clk = Abc_Clock();
    vPerm = Saig_ManFindIsoPerm( pAig, fVerbose );
    Vec_IntFree( vPerm );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return NULL;
}